

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_handle.cc
# Opt level: O2

void __thiscall absl::lts_20250127::cord_internal::CordzHandle::~CordzHandle(CordzHandle *this)

{
  pointer ppCVar1;
  pointer ppCVar2;
  CordzHandle *next;
  vector<absl::lts_20250127::cord_internal::CordzHandle_*,_std::allocator<absl::lts_20250127::cord_internal::CordzHandle_*>_>
  to_delete;
  MutexLock lock;
  CordzHandle *local_40;
  _Vector_base<absl::lts_20250127::cord_internal::CordzHandle_*,_std::allocator<absl::lts_20250127::cord_internal::CordzHandle_*>_>
  local_38;
  MutexLock local_20;
  
  this->_vptr_CordzHandle = (_func_int **)&PTR__CordzHandle_00437f10;
  anon_unknown_0::GlobalQueue();
  if (this->is_snapshot_ != true) {
    return;
  }
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_20.mu_ = (Mutex *)&anon_unknown_0::GlobalQueue::global_queue;
  Mutex::Lock((Mutex *)&anon_unknown_0::GlobalQueue::global_queue);
  local_40 = this->dq_next_;
  if (this->dq_prev_ == (CordzHandle *)0x0) {
    for (; local_40 != (CordzHandle *)0x0; local_40 = local_40->dq_next_) {
      if (local_40->is_snapshot_ != false) goto LAB_00274a43;
      std::
      vector<absl::lts_20250127::cord_internal::CordzHandle_*,_std::allocator<absl::lts_20250127::cord_internal::CordzHandle_*>_>
      ::push_back((vector<absl::lts_20250127::cord_internal::CordzHandle_*,_std::allocator<absl::lts_20250127::cord_internal::CordzHandle_*>_>
                   *)&local_38,&local_40);
    }
  }
  else {
    this->dq_prev_->dq_next_ = local_40;
    if (local_40 != (CordzHandle *)0x0) {
LAB_00274a43:
      local_40->dq_prev_ = this->dq_prev_;
      goto LAB_00274a88;
    }
  }
  anon_unknown_0::GlobalQueue::global_queue.impl_.space_._8_8_ = this->dq_prev_;
LAB_00274a88:
  MutexLock::~MutexLock(&local_20);
  ppCVar1 = local_38._M_impl.super__Vector_impl_data._M_finish;
  for (ppCVar2 = local_38._M_impl.super__Vector_impl_data._M_start; ppCVar2 != ppCVar1;
      ppCVar2 = ppCVar2 + 1) {
    if (*ppCVar2 != (CordzHandle *)0x0) {
      (*(*ppCVar2)->_vptr_CordzHandle[1])();
    }
  }
  std::
  _Vector_base<absl::lts_20250127::cord_internal::CordzHandle_*,_std::allocator<absl::lts_20250127::cord_internal::CordzHandle_*>_>
  ::~_Vector_base(&local_38);
  return;
}

Assistant:

CordzHandle::~CordzHandle() {
  Queue& global_queue = GlobalQueue();
  if (is_snapshot_) {
    std::vector<CordzHandle*> to_delete;
    {
      MutexLock lock(&global_queue.mutex);
      CordzHandle* next = dq_next_;
      if (dq_prev_ == nullptr) {
        // We were head of the queue, delete every CordzHandle until we reach
        // either the end of the list, or a snapshot handle.
        while (next && !next->is_snapshot_) {
          to_delete.push_back(next);
          next = next->dq_next_;
        }
      } else {
        // Another CordzHandle existed before this one, don't delete anything.
        dq_prev_->dq_next_ = next;
      }
      if (next) {
        next->dq_prev_ = dq_prev_;
      } else {
        global_queue.dq_tail.store(dq_prev_, std::memory_order_release);
      }
    }
    for (CordzHandle* handle : to_delete) {
      delete handle;
    }
  }
}